

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRAM.c
# Opt level: O1

uint16_t sanitize_VRAM_address(uint16_t address)

{
  ushort uVar1;
  ushort uVar2;
  
  uVar2 = address & 0x3fff;
  uVar1 = uVar2 - 0x1000;
  if (0xeff < (ushort)(uVar2 + 0xd000)) {
    uVar1 = uVar2;
  }
  uVar2 = uVar1 & 0x1f | 0x3f00;
  if (0xdf < (ushort)(uVar1 + 0xc0e0)) {
    uVar2 = uVar1;
  }
  uVar1 = uVar2 & 0xf | 0x3f00;
  if ((uVar2 & 0xfff3) != 0x3f10) {
    uVar1 = uVar2;
  }
  if ((uVar1 & 0xf400) == 0x2400 && mirroring == horizontal) {
    uVar1 = uVar1 & 0x2bff;
  }
  else {
    if (mirroring == vertical && (uVar1 & 0xf800) == 0x2800) {
      return uVar1 & 0x27ff;
    }
    if (mirroring == single_screen_high) {
      return uVar1 & 0x3ff | 0x2400;
    }
    if (mirroring == single_screen_low) {
      return uVar1 & 0x3ff | 0x2000;
    }
  }
  return uVar1;
}

Assistant:

static uint16_t sanitize_VRAM_address(uint16_t address) {
    address &= VRAM_WRAP_MASK;
    if(is_nametable_mirror(address)) address -= 0x1000;
    if(is_pallete_mirror(address)) address = PALLATE_TABLE_BASE_ADDR | (address & 0x1F);
    if(is_special_pallete_mirror(address)) address = PALLATE_TABLE_BASE_ADDR | (address & 0xF);

    // Four screen does not mirror
    if(is_horizontal_mirror(address)) address &= ~0x0400;
    else if(is_vertical_mirror(address)) address &= ~0x0800;
    else if(mirroring == single_screen_low) address = NAMETABLE1_BASE_ADDR | (address & 0x03FF);
    else if(mirroring == single_screen_high) address = NAMETABLE2_BASE_ADDR | (address & 0x03FF);
    return address;
}